

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O1

GlyphMetrics * __thiscall
FtFontRenderer::getGlyphMetrics
          (GlyphMetrics *__return_storage_ptr__,FtFontRenderer *this,GlyphIndex glyphIdx)

{
  FT_GlyphSlot_conflict pFVar1;
  int err;
  char32_t cp;
  runtime_error *this_00;
  char *pcVar2;
  FT_BBox bbox;
  string local_60;
  string local_40;
  
  err = FT_Load_Glyph(this->face,glyphIdx,this->loadFlags);
  if (err == 0) {
    (__return_storage_ptr__->size).w = 0;
    (__return_storage_ptr__->size).h = 0;
    (__return_storage_ptr__->offset).x = 0;
    (__return_storage_ptr__->offset).y = 0;
    pFVar1 = this->face->glyph;
    __return_storage_ptr__->advance = (int)((ulong)(pFVar1->advance).x >> 6);
    if (pFVar1->format == FT_GLYPH_FORMAT_BITMAP) {
      (__return_storage_ptr__->size).w = (pFVar1->bitmap).width;
      (__return_storage_ptr__->size).h = (pFVar1->bitmap).rows;
      (__return_storage_ptr__->offset).x = pFVar1->bitmap_left;
      (__return_storage_ptr__->offset).y = pFVar1->bitmap_top;
    }
    else {
      FT_Outline_Get_CBox(&pFVar1->outline,&local_60);
      (__return_storage_ptr__->size).w =
           (int)((local_60.field_2._M_allocated_capacity + 0x3f) -
                 ((ulong)local_60._M_dataplus._M_p & 0xffffffffffffffc0) >> 6);
      (__return_storage_ptr__->size).h =
           (int)((local_60.field_2._8_8_ + 0x3f) - (local_60._M_string_length & 0xffffffffffffffc0)
                >> 6);
      (__return_storage_ptr__->offset).x = (int)((ulong)local_60._M_dataplus._M_p >> 6);
      (__return_storage_ptr__->offset).y = (int)(local_60.field_2._8_8_ + 0x3f >> 6);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  cp = idxToCp(this->face,glyphIdx);
  pcVar2 = dpfb::unicode::cpToStr(cp);
  ftErrorToStr_abi_cxx11_(&local_40,err);
  dpfb::str::format_abi_cxx11_
            (&local_60,"Can\'t load glyph for %s: %s",pcVar2,local_40._M_dataplus._M_p);
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_00127848;
  __cxa_throw(this_00,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

dpfb::GlyphMetrics FtFontRenderer::getGlyphMetrics(
    dpfb::GlyphIndex glyphIdx) const
{
    auto err = FT_Load_Glyph(face, glyphIdx, loadFlags);
    if (err != FT_Err_Ok)
        throw dpfb::FontRendererError(
            dpfb::str::format(
                "Can't load glyph for %s: %s",
                dpfb::unicode::cpToStr(idxToCp(face, glyphIdx)),
                ftErrorToStr(err).c_str()));

    dpfb::GlyphMetrics glyphMetrics;
    glyphMetrics.advance = face->glyph->advance.x >> 6;

    if (face->glyph->format == FT_GLYPH_FORMAT_BITMAP) {
        // Embedded bitmap
        glyphMetrics.size.w = static_cast<int>(face->glyph->bitmap.width);
        glyphMetrics.size.h = static_cast<int>(face->glyph->bitmap.rows);
        glyphMetrics.offset.x = face->glyph->bitmap_left;
        glyphMetrics.offset.y = face->glyph->bitmap_top;
    } else {
        FT_BBox bbox;
        FT_Outline_Get_CBox(&face->glyph->outline, &bbox);

        // See:
        //  FreeType Glyph Conventions
        //      VI. FreeType outlines
        //          3. Coordinates, scaling and grid-fitting
        // https://www.freetype.org/freetype2/docs/glyphs/glyphs-6.html

        bbox.xMin = ftFoor(bbox.xMin);
        bbox.xMax = ftCeil(bbox.xMax);
        bbox.yMin = ftFoor(bbox.yMin);
        bbox.yMax = ftCeil(bbox.yMax);

        glyphMetrics.size.w = (bbox.xMax - bbox.xMin) >> 6;
        glyphMetrics.size.h = (bbox.yMax - bbox.yMin) >> 6;
        glyphMetrics.offset.x = bbox.xMin >> 6;
        glyphMetrics.offset.y = bbox.yMax >> 6;
    }

    return glyphMetrics;
}